

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_dls.cpp
# Opt level: O3

void Timidity::Parse_lart
               (DLS_Data *data,RIFF_Chunk *chunk,CONNECTIONLIST **conn_ptr,CONNECTION **connList_ptr
               )

{
  uint uVar1;
  uint *puVar2;
  CONNECTIONLIST *art;
  POOLTABLE PVar3;
  ULONG UVar4;
  
  PVar3 = (POOLTABLE)data->ptbl;
  while( true ) {
    if (PVar3 == (POOLTABLE)0x0) {
      return;
    }
    UVar4 = *(ULONG *)PVar3;
    if (UVar4 == 0x5453494c) {
      UVar4 = ((POOLTABLE *)((long)PVar3 + 8))->cbSize;
    }
    if ((UVar4 == 0x32747261) || (UVar4 == 0x31747261)) break;
    PVar3 = *(POOLTABLE *)((long)PVar3 + 0x20);
  }
  puVar2 = *(uint **)((long)PVar3 + 0x10);
  uVar1 = *puVar2;
  *(uint **)chunk = puVar2;
  *conn_ptr = (CONNECTIONLIST *)((ulong)uVar1 + (long)puVar2);
  return;
}

Assistant:

static void Parse_lart(DLS_Data *data, RIFF_Chunk *chunk, CONNECTIONLIST **conn_ptr, CONNECTION **connList_ptr)
{
	/* FIXME: This only supports one set of connections */
	for ( chunk = chunk->child; chunk; chunk = chunk->next ) {
		DWORD magic = (chunk->magic == FOURCC_LIST) ? chunk->subtype : chunk->magic;
		switch(magic) {
			case FOURCC_ART1:
			case FOURCC_ART2:
				Parse_art(data, chunk, conn_ptr, connList_ptr);
				return;
		}
	}
}